

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void DF_(PDISASM pMyDisasm)

{
  char *pcVar1;
  ulong uVar2;
  char (*__src) [8];
  byte bVar3;
  uint uVar4;
  
  (pMyDisasm->Reserved_).DECALAGE_EIP = 0;
  uVar2 = (pMyDisasm->Reserved_).EndOfBlock;
  if ((uVar2 != 0) && (uVar2 < (pMyDisasm->Reserved_).EIP_ + 2)) {
    (pMyDisasm->Reserved_).OutOfBlock = 1;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
    return;
  }
  bVar3 = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1);
  __src = RegistersFPU_Masm;
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x200) {
    __src = RegistersFPU_Nasm;
  }
  if (0xbf < (ulong)bVar3) {
    uVar2 = (ulong)bVar3 - 0xc0 >> 4;
    if (3 < uVar2) goto LAB_00115842;
    uVar4 = (uint)bVar3;
    switch(uVar2) {
    case 0:
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if ((bVar3 & 8) == 0) {
        (pMyDisasm->Instruction).Category = 0x20012;
        builtin_strncpy(pcVar1,"ffreep",7);
      }
      else {
        (pMyDisasm->Instruction).Category = 0x20001;
        builtin_strncpy(pcVar1,"fxch7",6);
LAB_001158ae:
        (pMyDisasm->Operand2).AccessMode = 2;
      }
      break;
    case 1:
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      (pMyDisasm->Instruction).Category = 0x20001;
      if ((bVar3 & 8) != 0) {
        builtin_strncpy(pcVar1,"fstp9",6);
        goto LAB_001158ae;
      }
      builtin_strncpy(pcVar1,"fstp8",6);
      break;
    case 2:
      if (uVar4 == 0xe0) {
        (pMyDisasm->Instruction).Category = 0x20012;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fstsw",6);
        goto LAB_00115904;
      }
      if ((bVar3 & 8) != 0) {
        (pMyDisasm->Instruction).Category = 0x2000d;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fucomip",8);
        strcpy((pMyDisasm->Operand1).OpMnemonic,*__src);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 0x1000;
        (pMyDisasm->Operand1).Registers.fpu = REGS[0];
        (pMyDisasm->Operand1).OpSize = 0x50;
        uVar4 = uVar4 & 7;
        goto LAB_00115985;
      }
      goto LAB_00115842;
    case 3:
      uVar4 = uVar4 & 0xf;
      if (uVar4 < 8) {
        (pMyDisasm->Instruction).Category = 0x2000d;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fcomip",7);
        strcpy((pMyDisasm->Operand1).OpMnemonic,*__src);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 0x1000;
        (pMyDisasm->Operand1).Registers.fpu = REGS[0];
        (pMyDisasm->Operand1).OpSize = 0x50;
LAB_00115985:
        strcpy((pMyDisasm->Operand2).OpMnemonic,*__src + (uVar4 << 3));
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).Registers.fpu = *(Int64 *)((long)REGS + (ulong)(uVar4 << 3));
        (pMyDisasm->Operand2).OpSize = 0x50;
        goto LAB_00115904;
      }
LAB_00115842:
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
      (pMyDisasm->Operand1).AccessMode = 0;
      (pMyDisasm->Operand2).AccessMode = 0;
      (pMyDisasm->Operand3).AccessMode = 0;
      (pMyDisasm->Operand4).AccessMode = 0;
      (pMyDisasm->Operand5).AccessMode = 0;
      (pMyDisasm->Operand6).AccessMode = 0;
      (pMyDisasm->Operand7).AccessMode = 0;
      (pMyDisasm->Operand8).AccessMode = 0;
      (pMyDisasm->Operand9).AccessMode = 0;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
      goto LAB_00115904;
    }
    uVar2 = (ulong)((uVar4 & 7) << 3);
    strcpy((pMyDisasm->Operand1).OpMnemonic,*__src + uVar2);
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 0x1000;
    (pMyDisasm->Operand1).Registers.fpu = *(Int64 *)((long)REGS + uVar2);
    goto LAB_001158fa;
  }
  bVar3 = bVar3 >> 3 & 7;
  (pMyDisasm->Reserved_).REGOPCODE = (uint)bVar3;
  pcVar1 = (pMyDisasm->Instruction).Mnemonic;
  switch(bVar3) {
  case 0:
    (pMyDisasm->Reserved_).MemDecoration = 0x66;
    goto LAB_001157bd;
  case 1:
    (pMyDisasm->Reserved_).MemDecoration = 2;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic + 3,"ttp",4);
    break;
  case 2:
    (pMyDisasm->Reserved_).MemDecoration = 2;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    (pMyDisasm->Instruction).Mnemonic[4] = '\0';
    break;
  case 3:
    (pMyDisasm->Reserved_).MemDecoration = 2;
    goto LAB_00115735;
  case 4:
    (pMyDisasm->Reserved_).MemDecoration = 0x69;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy(pcVar1,"fbld",5);
    goto LAB_001157df;
  case 5:
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
LAB_001157bd:
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy(pcVar1,"fild",5);
LAB_001157df:
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 0x1000;
    (pMyDisasm->Operand1).Registers.fpu = 1;
LAB_001158fa:
    (pMyDisasm->Operand1).OpSize = 0x50;
    goto LAB_00115904;
  case 6:
    (pMyDisasm->Reserved_).MemDecoration = 5;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy(pcVar1,"fbstp",6);
    goto LAB_00115783;
  case 7:
    (pMyDisasm->Reserved_).MemDecoration = 4;
LAB_00115735:
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    (pMyDisasm->Instruction).Mnemonic[4] = 'p';
    (pMyDisasm->Instruction).Mnemonic[5] = '\0';
  }
  builtin_strncpy(pcVar1,"fist",4);
LAB_00115783:
  (pMyDisasm->Operand2).OpType = 0x20000;
  (pMyDisasm->Operand2).Registers.type = 0x1000;
  (pMyDisasm->Operand2).Registers.fpu = 1;
  (pMyDisasm->Operand2).OpSize = 0x50;
LAB_00115904:
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ DF_(PDISASM pMyDisasm)
{
  long MyMODRM;
  char (*pRegistersFPU)[8][8] ;

  GV.DECALAGE_EIP = 0;
  if (!Security(2, pMyDisasm)) {return;}
  MyMODRM = *((UInt8*) (GV.EIP_+1));
  pRegistersFPU = &RegistersFPU_Masm;
  if (GV.SYNTAX_ == NasmSyntax) {
      pRegistersFPU = &RegistersFPU_Nasm;
  }
  if (MyMODRM <= 0xbf) {

      GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
      switch (GV.REGOPCODE) {
      case 0:
          GV.MemDecoration = Arg2word;
          decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fild");
          #endif
          pMyDisasm->Operand1.OpType = REGISTER_TYPE;
          pMyDisasm->Operand1.Registers.type = FPU_REG;
          pMyDisasm->Operand1.Registers.fpu = REG0;
          pMyDisasm->Operand1.OpSize = 80;
      break;
      case 1:
          GV.MemDecoration = Arg1word;
          decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fisttp");
          #endif
          pMyDisasm->Operand2.OpType = REGISTER_TYPE;
          pMyDisasm->Operand2.Registers.type = FPU_REG;
          pMyDisasm->Operand2.Registers.fpu = REG0;
          pMyDisasm->Operand2.OpSize = 80;
      break;
      case 2:
          GV.MemDecoration = Arg1word;
          decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fist");
          #endif
          pMyDisasm->Operand2.OpType = REGISTER_TYPE;
          pMyDisasm->Operand2.Registers.type = FPU_REG;
          pMyDisasm->Operand2.Registers.fpu = REG0;
          pMyDisasm->Operand2.OpSize = 80;
      break;
      case 3:
          GV.MemDecoration = Arg1word;
          decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fistp");
          #endif
          pMyDisasm->Operand2.OpType = REGISTER_TYPE;
          pMyDisasm->Operand2.Registers.type = FPU_REG;
          pMyDisasm->Operand2.Registers.fpu = REG0;
          pMyDisasm->Operand2.OpSize = 80;
      break;
      case 4:
          GV.MemDecoration = Arg2multibytes;
          decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fbld");
          #endif
          pMyDisasm->Operand1.OpType = REGISTER_TYPE;
          pMyDisasm->Operand1.Registers.type = FPU_REG;
          pMyDisasm->Operand1.Registers.fpu = REG0;
          pMyDisasm->Operand1.OpSize = 80;
      break;
      case 5:
          GV.MemDecoration = Arg2qword;
          decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fild");
          #endif
          pMyDisasm->Operand1.OpType = REGISTER_TYPE;
          pMyDisasm->Operand1.Registers.type = FPU_REG;
          pMyDisasm->Operand1.Registers.fpu = REG0;
          pMyDisasm->Operand1.OpSize = 80;
      break;
      case 6:
          GV.MemDecoration = Arg1multibytes;
          decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fbstp");
          #endif
          pMyDisasm->Operand2.OpType = REGISTER_TYPE;
          pMyDisasm->Operand2.Registers.type = FPU_REG;
          pMyDisasm->Operand2.Registers.fpu = REG0;
          pMyDisasm->Operand2.OpSize = 80;
      break;
      case 7:
          GV.MemDecoration = Arg1qword;
          decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fistp");
          #endif
          pMyDisasm->Operand2.OpType = REGISTER_TYPE;
          pMyDisasm->Operand2.Registers.type = FPU_REG;
          pMyDisasm->Operand2.Registers.fpu = REG0;
          pMyDisasm->Operand2.OpSize = 80;
      break;
      default:
          failDecode(pMyDisasm);
      }
  }
  else {
      if ((MyMODRM & 0xf0) == 0xc0) {
        if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "ffreep");
          #endif
        }
        else {
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fxch7");
          #endif
          pMyDisasm->Operand2.AccessMode = WRITE;
        }
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
        #endif
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = FPU_REG;
        pMyDisasm->Operand1.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
        pMyDisasm->Operand1.OpSize = 80;
      }
      else if ((MyMODRM & 0xf0) == 0xd0) {
        if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fstp8");
          #endif
        }
        else {
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fstp9");
          #endif
          pMyDisasm->Operand2.AccessMode = WRITE;
        }
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
        #endif
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = FPU_REG;
        pMyDisasm->Operand1.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
        pMyDisasm->Operand1.OpSize = 80;

      }
      else if ((MyMODRM & 0xf0) == 0xe0) {
        if (MyMODRM == 0xe0) {
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fstsw");
          #endif
        }
        else if ((MyMODRM & 0xf) >=8) {
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+COMPARISON_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fucomip");
          #endif
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[0]);
          #endif
          pMyDisasm->Operand1.OpType = REGISTER_TYPE;
          pMyDisasm->Operand1.Registers.type = FPU_REG;
          pMyDisasm->Operand1.Registers.fpu = REGS[0];
          pMyDisasm->Operand1.OpSize = 80;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Operand2.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
          #endif
          pMyDisasm->Operand2.OpType = REGISTER_TYPE;
          pMyDisasm->Operand2.Registers.type = FPU_REG;
          pMyDisasm->Operand2.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
          pMyDisasm->Operand2.OpSize = 80;
        }
        else {
          failDecode(pMyDisasm);
        }
      }

      else if ((MyMODRM & 0xf0) == 0xf0) {
        if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+COMPARISON_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fcomip");
          #endif
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[0]);
          #endif
          pMyDisasm->Operand1.OpType = REGISTER_TYPE;
          pMyDisasm->Operand1.Registers.type = FPU_REG;
          pMyDisasm->Operand1.Registers.fpu = REGS[0];
          pMyDisasm->Operand1.OpSize = 80;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Operand2.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
          #endif
          pMyDisasm->Operand2.OpType = REGISTER_TYPE;
          pMyDisasm->Operand2.Registers.type = FPU_REG;
          pMyDisasm->Operand2.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
          pMyDisasm->Operand2.OpSize = 80;
        }
        else {
            failDecode(pMyDisasm);
        }
      }
      else {
          failDecode(pMyDisasm);
      }
  }
  GV.EIP_ += GV.DECALAGE_EIP+2;
}